

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QList<QString> * __thiscall
(anonymous_namespace)::splitString<QList<QString>,QString>
          (QList<QString> *__return_storage_ptr__,void *this,QString *source,QStringView sep,
          SplitBehavior behavior,CaseSensitivity cs)

{
  qsizetype qVar1;
  long lVar2;
  long lVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QStringView haystack0;
  QStringView haystack0_00;
  QStringView needle0;
  QStringView needle0_00;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pcVar5 = *(char16_t **)((long)this + 8);
  lVar3 = *(long *)((long)this + 0x10);
  pcVar4 = pcVar5;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar4 = L"";
  }
  lVar2 = 0;
  haystack0.m_data = pcVar4;
  haystack0.m_size = lVar3;
  needle0.m_data = (storage_type_conflict *)sep.m_size;
  needle0.m_size = (qsizetype)source;
  qVar1 = QtPrivate::findString
                    (haystack0,0,needle0,
                     (CaseSensitivity)
                     behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                     super_QFlagsStorage<Qt::SplitBehaviorFlags>.i);
  if (qVar1 != -1) {
    lVar2 = 0;
    do {
      if (qVar1 - lVar2 != 0 || (int)sep.m_data == 0) {
        QString::QString(&local_50,(QChar *)(pcVar5 + lVar2),qVar1 - lVar2);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_50);
        QList<QString>::end(__return_storage_ptr__);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      pcVar5 = *(char16_t **)((long)this + 8);
      lVar3 = *(long *)((long)this + 0x10);
      pcVar4 = pcVar5;
      if (pcVar5 == (char16_t *)0x0) {
        pcVar4 = L"";
      }
      lVar2 = (long)&(source->d).d + qVar1;
      haystack0_00.m_data = pcVar4;
      haystack0_00.m_size = lVar3;
      needle0_00.m_data = (storage_type_conflict *)sep.m_size;
      needle0_00.m_size = (qsizetype)source;
      qVar1 = QtPrivate::findString
                        (haystack0_00,lVar2 + (ulong)(source == (QString *)0x0),needle0_00,
                         (CaseSensitivity)
                         behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                         super_QFlagsStorage<Qt::SplitBehaviorFlags>.i);
    } while (qVar1 != -1);
  }
  if ((int)sep.m_data == 0 || lVar3 - lVar2 != 0) {
    QString::QString(&local_50,(QChar *)(pcVar5 + lVar2),lVar3 - lVar2);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_50);
    QList<QString>::end(__return_storage_ptr__);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static ResultList splitString(const StringSource &source, QStringView sep,
                              Qt::SplitBehavior behavior, Qt::CaseSensitivity cs)
{
    ResultList list;
    typename StringSource::size_type start = 0;
    typename StringSource::size_type end;
    typename StringSource::size_type extra = 0;
    while ((end = QtPrivate::findString(QStringView(source.constData(), source.size()), start + extra, sep, cs)) != -1) {
        if (start != end || behavior == Qt::KeepEmptyParts)
            list.append(source.sliced(start, end - start));
        start = end + sep.size();
        extra = (sep.size() == 0 ? 1 : 0);
    }
    if (start != source.size() || behavior == Qt::KeepEmptyParts)
        list.append(source.sliced(start));
    return list;
}